

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O2

int __thiscall Polynomial::copy(Polynomial *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  double *pdVar1;
  double *pdVar2;
  uint in_ECX;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->ocount = in_ECX;
  uVar5 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)in_ECX) {
    uVar4 = (ulong)in_ECX << 3;
  }
  uVar3 = (ulong)in_ECX;
  if ((int)in_ECX < 1) {
    uVar3 = uVar5;
  }
  pdVar1 = (double *)operator_new__(uVar4);
  this->osx = pdVar1;
  pdVar2 = (double *)operator_new__(uVar4);
  this->osy = pdVar2;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pdVar1[uVar5] = *(double *)(dst + uVar5 * 8);
    pdVar2[uVar5] = *(double *)(src + uVar5 * 8);
  }
  return (int)pdVar2;
}

Assistant:

void Polynomial::copy(double *x, double *y, int count)
{
    ocount = count;
    osx = new double[count] , osy = new double[count];
    for(int i(0) ; i < count ; i++)
    {
        osx[i] = x[i] ;
        osy[i] = y[i] ;
    }
}